

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

void __thiscall MapLoader::~MapLoader(MapLoader *this)

{
  MapLoader *this_local;
  
  ~MapLoader(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

MapLoader::~MapLoader() {
    delete pMapFile;
}